

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSetSpillSize(Btree *p,int mxPage)

{
  int iVar1;
  int res;
  BtShared *pBt;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  
  uVar2 = 0xaaaaaaaa;
  sqlite3BtreeEnter((Btree *)0x1a0b4d);
  iVar1 = sqlite3PagerSetSpillsize
                    ((Pager *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  sqlite3BtreeLeave((Btree *)0x1a0b6c);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetSpillSize(Btree *p, int mxPage){
  BtShared *pBt = p->pBt;
  int res;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  res = sqlite3PagerSetSpillsize(pBt->pPager, mxPage);
  sqlite3BtreeLeave(p);
  return res;
}